

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O0

int PurgeDataAndWaitNsMDM(MDM *pMDM,BOOL *pbError,int n)

{
  int iVar1;
  int n_local;
  BOOL *pbError_local;
  MDM *pMDM_local;
  
  iVar1 = PurgeDataMDM(pMDM);
  if (iVar1 == 0) {
    iVar1 = WaitNsMDM(n);
    if (iVar1 == 0) {
      pMDM_local._4_4_ = 0;
    }
    else {
      pMDM_local._4_4_ = 1;
    }
  }
  else {
    *pbError = 1;
    pMDM_local._4_4_ = 1;
  }
  return pMDM_local._4_4_;
}

Assistant:

inline int PurgeDataAndWaitNsMDM(MDM* pMDM, BOOL* pbError, int n)
{
	if (PurgeDataMDM(pMDM) != EXIT_SUCCESS)
	{
		*pbError = TRUE;
		return EXIT_FAILURE;
	}
	if (WaitNsMDM(n) != EXIT_SUCCESS) return EXIT_FAILURE;

	return EXIT_SUCCESS;
}